

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-base.h
# Opt level: O0

void __thiscall
dynamicgraph::SignalBase<int>::ExtractNodeAndLocalNames
          (SignalBase<int> *this,string *LocalName,string *NodeName)

{
  string *psVar1;
  string local_a8 [32];
  undefined8 local_88;
  size_t IdxPosNodeNameEnd;
  size_t IdxPosNodeNameStart;
  undefined8 local_48;
  size_t IdxPosLocalName;
  string fullname;
  string *NodeName_local;
  string *LocalName_local;
  SignalBase<int> *this_local;
  
  fullname.field_2._8_8_ = NodeName;
  psVar1 = getName_abi_cxx11_(this);
  std::__cxx11::string::string((string *)&IdxPosLocalName,(string *)psVar1);
  local_48 = std::__cxx11::string::rfind((char *)&IdxPosLocalName,0x14b231);
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)&IdxPosNodeNameStart,(ulong)&IdxPosLocalName);
  std::__cxx11::string::operator=((string *)LocalName,(string *)&IdxPosNodeNameStart);
  std::__cxx11::string::~string((string *)&IdxPosNodeNameStart);
  IdxPosNodeNameEnd = std::__cxx11::string::find((char *)&IdxPosLocalName,0x14bd2a);
  local_88 = std::__cxx11::string::find((char *)&IdxPosLocalName,0x14b06f);
  std::__cxx11::string::substr((ulong)local_a8,(ulong)&IdxPosLocalName);
  std::__cxx11::string::operator=((string *)fullname.field_2._8_8_,local_a8);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string((string *)&IdxPosLocalName);
  return;
}

Assistant:

virtual void ExtractNodeAndLocalNames(std::string &LocalName,
                                        std::string &NodeName) const {
    std::string fullname = this->getName();

    size_t IdxPosLocalName = fullname.rfind(":");
    LocalName = fullname.substr(IdxPosLocalName + 1,
                                fullname.length() - IdxPosLocalName + 1);
    size_t IdxPosNodeNameStart = fullname.find("(");
    size_t IdxPosNodeNameEnd = fullname.find(")");
    NodeName = fullname.substr(IdxPosNodeNameStart + 1,
                               IdxPosNodeNameEnd - IdxPosNodeNameStart - 1);
  }